

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  pointer pMVar4;
  int iVar5;
  ulong uVar6;
  ostream *poVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  Mat *x;
  pointer pMVar12;
  double dVar13;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  vector<cv::Mat,_std::allocator<cv::Mat>_> bads;
  vector<cv::Mat,_std::allocator<cv::Mat>_> goods;
  classifier classifier;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_120;
  vector<cv::Mat,_std::allocator<cv::Mat>_> local_108;
  ulong local_f0;
  ulong local_e8;
  long local_e0;
  string local_d8 [3];
  template_classifier local_78;
  
  paVar1 = &local_d8[0].field_2;
  local_d8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"../armor","");
  sp::template_classifier::template_classifier(&local_78,local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8[0]._M_dataplus._M_p);
  }
  local_d8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"../data/positive","");
  get_test_src(&local_108,local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8[0]._M_dataplus._M_p);
  }
  local_d8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"../data/negative","");
  get_test_src(&local_120,local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8[0]._M_dataplus._M_p);
  }
  local_f0 = (long)local_108.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_108.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start;
  local_e8 = (long)local_120.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_120.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start;
  local_e0 = std::chrono::_V2::system_clock::now();
  pMVar4 = local_108.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar9 = 0;
  iVar10 = 0;
  if (local_108.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_108.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar10 = 0;
    pMVar12 = local_108.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      cv::Mat::Mat((Mat *)local_d8,pMVar12);
      iVar5 = sp::template_classifier::forward(&local_78,(Mat *)local_d8);
      lVar11 = (long)local_78.good_templates.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_78.good_templates.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      cv::Mat::~Mat((Mat *)local_d8);
      iVar10 = iVar10 + (uint)((ulong)(long)iVar5 < (ulong)((lVar11 >> 5) * -0x5555555555555555));
      pMVar12 = pMVar12 + 0x60;
    } while (pMVar12 != pMVar4);
  }
  pMVar4 = local_120.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_120.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_120.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar9 = 0;
    pMVar12 = local_120.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      cv::Mat::Mat((Mat *)local_d8,pMVar12);
      iVar5 = sp::template_classifier::forward(&local_78,(Mat *)local_d8);
      lVar11 = (long)local_78.good_templates.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_78.good_templates.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      cv::Mat::~Mat((Mat *)local_d8);
      iVar9 = (iVar9 + 1) -
              (uint)((ulong)(long)iVar5 < (ulong)((lVar11 >> 5) * -0x5555555555555555));
      pMVar12 = pMVar12 + 0x60;
    } while (pMVar12 != pMVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Average bench time: ",0x14);
  uVar6 = local_f0 >> 5;
  uVar8 = local_e8 >> 5;
  lVar11 = std::chrono::_V2::system_clock::now();
  dVar13 = (double)((int)uVar8 * -0x55555555 + (int)uVar6 * -0x55555555);
  poVar7 = std::ostream::_M_insert<double>(((double)(lVar11 - local_e0) * 1e-06) / dVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ms\n",4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"goods right: ",0xd);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," / ",3);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ~ ",3);
  auVar2._8_8_ = in_XMM2_Qb;
  auVar2._0_8_ = in_XMM2_Qa;
  auVar2 = vcvtusi2sd_avx512f(auVar2,((long)local_108.
                                            super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_108.
                                            super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                            _M_impl.super__Vector_impl_data._M_start >> 5) *
                                     -0x5555555555555555);
  poVar7 = std::ostream::_M_insert<double>(((double)iVar10 * 100.0) / auVar2._0_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," %\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"bads  right: ",0xd);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," / ",3);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ~ ",3);
  auVar3._8_8_ = in_XMM2_Qb;
  auVar3._0_8_ = in_XMM2_Qa;
  auVar2 = vcvtusi2sd_avx512f(auVar3,((long)local_120.
                                            super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_120.
                                            super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>.
                                            _M_impl.super__Vector_impl_data._M_start >> 5) *
                                     -0x5555555555555555);
  poVar7 = std::ostream::_M_insert<double>(((double)iVar9 * 100.0) / auVar2._0_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," %\n",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total accuracy: ",0x10);
  poVar7 = std::ostream::_M_insert<double>(((double)(iVar9 + iVar10) * 100.0) / dVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," %\n",3);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_120);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_108);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_78.bad_templates);
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector(&local_78.good_templates);
  return 0;
}

Assistant:

int main()
{
	sp::classifier classifier("../armor");
	// classifier.debug_prepared_show(cv::imread("../armor/positive/T2.png", cv::IMREAD_GRAYSCALE));
	// cv::waitKey();
	auto goods = get_test_src("../data/positive");
	auto bads  = get_test_src("../data/negative");

	int total = goods.size() + bads.size();
	int goods_right = 0;
	int bads_right  = 0;

	// @@@ test time.
	timer t;

	for(auto&& x : goods)
		goods_right += classifier.boolean_forward(x);
	for(auto&& x : bads )
		bads_right  += !classifier.boolean_forward(x);

	std::cout << "Average bench time: " << t.milli_cnt() / total << " ms\n";

	std::cout << "goods right: " << goods_right << " / " << goods.size() << " ~ " << static_cast<double>(goods_right) / goods.size() * 100 << " %\n";
	std::cout << "bads  right: " << bads_right  << " / " << bads.size()  << " ~ " << static_cast<double>(bads_right )  / bads.size() * 100<< " %\n";
	std::cout << "Total accuracy: " << static_cast<double>(goods_right + bads_right) / total * 100 << " %\n";

}